

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O1

CAmount __thiscall wallet::SelectionResult::GetTotalBumpFees(SelectionResult *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  for (p_Var2 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    lVar3 = lVar3 + *(long *)(*(long *)(p_Var2 + 1) + 0x98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar3 - this->bump_fee_group_discount;
  }
  __stack_chk_fail();
}

Assistant:

CAmount SelectionResult::GetTotalBumpFees() const
{
    return std::accumulate(m_selected_inputs.cbegin(), m_selected_inputs.cend(), CAmount{0}, [](CAmount sum, const auto& coin) { return sum + coin->ancestor_bump_fees; }) - bump_fee_group_discount;
}